

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::String::Formata(String *this,char *fmt,...)

{
  bool bVar1;
  char in_AL;
  int iVar2;
  bstring b;
  size_t sVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arglist;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((this->super_tagbstring).mlen < 1) {
    Formata();
  }
  if (fmt != (char *)0x0) {
    b = bfromcstr("");
    if (b != (bstring)0x0) {
      sVar3 = strlen(fmt);
      iVar2 = (int)sVar3 * 2;
      iVar4 = 0x10;
      if (0x10 < iVar2) {
        iVar4 = iVar2;
      }
      iVar2 = balloc(b,iVar4 + 2);
      while (iVar2 == 0) {
        local_f8 = local_e8;
        local_100 = &arglist[0].overflow_arg_area;
        local_108 = 0x3000000010;
        iVar2 = vsnprintf((char *)b->data,(long)(iVar4 + 1),fmt,&local_108);
        b->data[iVar4] = '\0';
        sVar3 = strlen((char *)b->data);
        b->slen = (int)sVar3;
        if ((int)sVar3 < iVar4) goto LAB_0011122f;
        bVar1 = iVar4 < iVar2;
        iVar4 = iVar4 * 2;
        if (bVar1) {
          iVar4 = iVar2;
        }
        iVar2 = balloc(b,iVar4 + 2);
      }
      b = bformat("<OUTM>");
LAB_0011122f:
      operator+=(this,b);
      bdestroy(b);
      return;
    }
  }
  operator+=(this,"<NULL>");
  return;
}

Assistant:

void String::Formata(const char * fmt, ...)
    {
        bstring b;
        va_list arglist;
        int r, n;

        if (mlen <= 0)     bstringThrow("Write protection error");
        if (fmt == NULL)
        {
            *this += "<NULL>";
        }
        else
        {
            if ((b = bfromcstr("")) == NULL)
            {
                *this += "<NULL>";
            }
            else
            {
                if ((n = 2*(int)strlen(fmt)) < START_VSNBUFF)
                    n = START_VSNBUFF;
                for (;;)
                {
                    if (BSTR_OK != balloc(b, n + 2))
                    {
                        b = bformat("<OUTM>");
                        break;
                    }

                    va_start(arglist, fmt);
                    exvsnprintf(r, (char *) b->data, n + 1, fmt, arglist);
                    va_end(arglist);

                    b->data[n] = '\0';
                    b->slen = (int)strlen((char *) b->data);

                    if (b->slen < n)    break;
                    if (r > n)            n = r;
                    else                 n += n;
                }
                *this += *b;
                bdestroy(b);
            }
        }
    }